

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O0

void dictionary_dump(dictionary *d,FILE *out)

{
  char *local_38;
  long local_20;
  ssize_t i;
  FILE *out_local;
  dictionary *d_local;
  
  if ((d != (dictionary *)0x0) && (out != (FILE *)0x0)) {
    if (d->n < 1) {
      fprintf((FILE *)out,"empty dictionary\n");
    }
    else {
      for (local_20 = 0; local_20 < d->size; local_20 = local_20 + 1) {
        if (d->key[local_20] != (char *)0x0) {
          if (d->val[local_20] == (char *)0x0) {
            local_38 = "UNDEF";
          }
          else {
            local_38 = d->val[local_20];
          }
          fprintf((FILE *)out,"%20s\t[%s]\n",d->key[local_20],local_38);
        }
      }
    }
  }
  return;
}

Assistant:

void dictionary_dump(const dictionary * d, FILE * out)
{
    ssize_t  i ;

    if (d == NULL || out == NULL) return ;
    if (d->n < 1) {
        fprintf(out, "empty dictionary\n");
        return ;
    }
    for (i = 0 ; i < d->size ; i++) {
        if (d->key[i]) {
            fprintf(out, "%20s\t[%s]\n",
                    d->key[i],
                    d->val[i] ? d->val[i] : "UNDEF");
        }
    }
    return ;
}